

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalWideUnicode::map_utf8
          (CCharmapToLocalWideUnicode *this,char *dest,size_t dest_len,utf8_ptr src,
          size_t src_byte_len,size_t *src_bytes_used)

{
  wchar_t wVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RCX;
  ulong in_RDX;
  utf8_ptr *in_RSI;
  long in_R8;
  long *in_R9;
  wchar_t *destw;
  char *srcend;
  size_t cur_total;
  utf8_ptr src_start;
  utf8_ptr *this_00;
  size_t local_40;
  utf8_ptr local_38;
  long *local_30;
  long local_28;
  ulong local_20;
  utf8_ptr *local_18;
  utf8_ptr local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_8.p_ = in_RCX;
  utf8_ptr::utf8_ptr(&local_38);
  local_38.p_ = local_8.p_;
  pcVar2 = utf8_ptr::getptr(&local_8);
  local_40 = 0;
  this_00 = local_18;
  while (pcVar3 = utf8_ptr::getptr(&local_8), pcVar3 < pcVar2 + local_28) {
    if (local_18 != (utf8_ptr *)0x0) {
      if (local_20 < 4) break;
      wVar1 = utf8_ptr::getch((utf8_ptr *)0x23fb7a);
      *(wchar_t *)&this_00->p_ = wVar1;
      local_20 = local_20 - 4;
      this_00 = (utf8_ptr *)((long)&this_00->p_ + 4);
    }
    local_40 = local_40 + 4;
    utf8_ptr::inc(this_00);
  }
  if (local_30 != (long *)0x0) {
    pcVar2 = utf8_ptr::getptr(&local_8);
    pcVar3 = utf8_ptr::getptr(&local_38);
    *local_30 = (long)pcVar2 - (long)pcVar3;
  }
  return local_40;
}

Assistant:

size_t CCharmapToLocalWideUnicode::
   map_utf8(char *dest, size_t dest_len,
            utf8_ptr src, size_t src_byte_len,
            size_t *src_bytes_used) const
{
    utf8_ptr src_start;
    size_t cur_total;
    char *srcend;
    wchar_t *destw;

    /* remember where we started */
    src_start = src;

    /* compute where the source buffer ends */
    srcend = src.getptr() + src_byte_len;

    /* set up a wchar_t output pointer for convenience */
    destw = (wchar_t *)dest;

    /* copy characters until we reach the end of the source string */
    for (cur_total = 0 ; src.getptr() < srcend ; src.inc())
    {
        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest == 0)
        {
            /* we're just counting - don't store anything */
        }
        else if (dest_len >= sizeof(wchar_t))
        {
            /* add the sequence */
            *destw++ = src.getch();

            /* adjust the length remaining */
            dest_len -= sizeof(wchar_t);
        }
        else
        {
            /* it doesn't fit - stop now */
            break;
        }

        /* count the length in the total */
        cur_total += sizeof(wchar_t);
    }

    /* if the caller wants to know how much space we used, tell them */
    if (src_bytes_used != 0)
        *src_bytes_used = src.getptr() - src_start.getptr();

    /* return the total length of the result */
    return cur_total;
}